

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  char **argv_local;
  int argc_local;
  
  GREATEST_INIT();
  greatest_parse_options(argc,argv);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  tinf_init();
  greatest_run_suite(tinflate,"tinflate");
  greatest_run_suite(tinfzlib,"tinfzlib");
  greatest_run_suite(tinfgzip,"tinfgzip");
  GREATEST_PRINT_REPORT();
  iVar1 = greatest_all_passed();
  return (uint)(iVar1 == 0);
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}